

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeEnsemble.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::TreeEnsembleRegressor::SharedCtor(TreeEnsembleRegressor *this)

{
  TreeEnsembleRegressor *this_local;
  
  memset(&this->treeensemble_,0,0xc);
  return;
}

Assistant:

inline void TreeEnsembleRegressor::SharedCtor() {
::memset(reinterpret_cast<char*>(this) + static_cast<size_t>(
    reinterpret_cast<char*>(&treeensemble_) - reinterpret_cast<char*>(this)),
    0, static_cast<size_t>(reinterpret_cast<char*>(&postevaluationtransform_) -
    reinterpret_cast<char*>(&treeensemble_)) + sizeof(postevaluationtransform_));
}